

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

string_view __thiscall libtorrent::aux::strip_string(aux *this,string_view in)

{
  string_view sVar1;
  bool bVar2;
  const_reference pvVar3;
  bool local_2a;
  bool local_29;
  undefined1 auStack_28 [8];
  string_view in_local;
  
  in_local._M_len = in._M_len;
  auStack_28 = (undefined1  [8])this;
  while( true ) {
    bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
    local_29 = false;
    if (!bVar2) {
      pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
      local_29 = is_space(*pvVar3);
    }
    if (local_29 == false) break;
    ::std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,1);
  }
  while( true ) {
    bVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
    local_2a = false;
    if (!bVar2) {
      pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::back
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
      local_2a = is_space(*pvVar3);
    }
    if (local_2a == false) break;
    ::std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,1);
  }
  sVar1._M_str = (char *)in_local._M_len;
  sVar1._M_len = (size_t)auStack_28;
  return sVar1;
}

Assistant:

string_view strip_string(string_view in)
	{
		while (!in.empty() && is_space(in.front()))
			in.remove_prefix(1);

		while (!in.empty() && is_space(in.back()))
			in.remove_suffix(1);
		return in;
	}